

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string * el::base::utils::Str::replaceAll(string *str,string *replaceWhat,string *replaceWith)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  pointer __s1;
  
  __n = replaceWhat->_M_string_length;
  if (__n == replaceWith->_M_string_length) {
    if (__n == 0) {
      return str;
    }
    __s1 = (replaceWhat->_M_dataplus)._M_p;
    iVar1 = bcmp(__s1,(replaceWith->_M_dataplus)._M_p,__n);
    if (iVar1 == 0) {
      return str;
    }
  }
  else {
    __s1 = (replaceWhat->_M_dataplus)._M_p;
  }
  for (uVar2 = ::std::__cxx11::string::find((char *)str,(ulong)__s1,0); uVar2 != 0xffffffffffffffff;
      uVar2 = ::std::__cxx11::string::find
                        ((char *)str,(ulong)(replaceWhat->_M_dataplus)._M_p,uVar2 + 1)) {
    ::std::__cxx11::string::replace
              ((ulong)str,uVar2,(char *)replaceWhat->_M_string_length,
               (ulong)(replaceWith->_M_dataplus)._M_p);
  }
  return str;
}

Assistant:

std::string& Str::replaceAll(std::string& str, const std::string& replaceWhat,
                             const std::string& replaceWith) {
  if (replaceWhat == replaceWith)
    return str;
  std::size_t foundAt = std::string::npos;
  while ((foundAt = str.find(replaceWhat, foundAt + 1)) != std::string::npos) {
    str.replace(foundAt, replaceWhat.length(), replaceWith);
  }
  return str;
}